

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

natwm_error parser_read_value(parser *parser,char **result,size_t *length)

{
  natwm_error nVar1;
  undefined8 in_R9;
  undefined8 uVar2;
  size_t local_40;
  size_t end_pos;
  char *value_stripped;
  size_t value_stripped_length;
  char *value;
  
  uVar2 = 0x106ff3;
  value_stripped_length = 0;
  local_40 = 0;
  nVar1 = string_get_delimiter
                    (parser->buffer + parser->pos + 1,'\n',(char **)&value_stripped_length,&local_40
                     ,false);
  if (nVar1 == NO_ERROR) {
    end_pos = 0;
    value_stripped = (char *)0x0;
    nVar1 = string_strip_surrounding_spaces
                      ((char *)value_stripped_length,(char **)&end_pos,(size_t *)&value_stripped);
    if (nVar1 == NO_ERROR) {
      free((void *)value_stripped_length);
      parser_move(parser,local_40);
      *result = (char *)end_pos;
      if (length == (size_t *)0x0) {
        return NO_ERROR;
      }
      *length = (size_t)value_stripped;
      return NO_ERROR;
    }
    internal_logger(natwm_logger,LEVEL_ERROR,"Found invalid item value - Line %zu Col: %zu",
                    parser->line_num,parser->col_num,in_R9,uVar2);
    free((void *)value_stripped_length);
  }
  else {
    internal_logger(natwm_logger,LEVEL_ERROR,"Failed to read item value - Line %zu Col: %zu",
                    parser->line_num,parser->col_num,in_R9,uVar2);
  }
  return INVALID_INPUT_ERROR;
}

Assistant:

enum natwm_error parser_read_value(struct parser *parser, char **result, size_t *length)
{
        enum natwm_error err = GENERIC_ERROR;
        // We need to ignore the EQUAL_CHAR
        const char *line = (parser->buffer + parser->pos) + 1;
        char *value = NULL;
        size_t end_pos = 0;

        err = string_get_delimiter(line, '\n', &value, &end_pos, false);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger,
                          "Failed to read item value - Line %zu Col: %zu",
                          parser->line_num,
                          parser->col_num);

                return INVALID_INPUT_ERROR;
        }

        // Now we need to strip the surrounding spaces to be left with the value
        // string

        char *value_stripped = NULL;
        size_t value_stripped_length = 0;

        err = string_strip_surrounding_spaces(value, &value_stripped, &value_stripped_length);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger,
                          "Found invalid item value - Line %zu Col: %zu",
                          parser->line_num,
                          parser->col_num);

                free(value);

                return INVALID_INPUT_ERROR;
        }

        // Free intermediate values
        free(value);

        // Update the parser position to the end of the line
        parser_move(parser, end_pos);

        *result = value_stripped;

        SET_IF_NON_NULL(length, value_stripped_length);

        return NO_ERROR;
}